

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O3

void __thiscall chrono::ChFseqNode::ArchiveIN(ChFseqNode *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFseqNode>(marchive);
  local_38._name = "fx";
  local_38._flags = '\0';
  local_38._value = &this->fx;
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->duration;
  local_38._name = "duration";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->weight;
  local_38._name = "weight";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->t_start;
  local_38._name = "t_start";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->t_end;
  local_38._name = "t_end";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->Iy;
  local_38._name = "Iy";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->Iydt;
  local_38._name = "Iydt";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->Iydtdt;
  local_38._name = "Iydtdt";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->y_cont;
  local_38._name = "y_cont";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->ydt_cont;
  local_38._name = "ydt_cont";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->ydtdt_cont;
  local_38._name = "ydtdt_cont";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChFseqNode::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFseqNode>();

    // stream in all member data:
    marchive >> CHNVP(fx);
    marchive >> CHNVP(duration);
    marchive >> CHNVP(weight);
    marchive >> CHNVP(t_start);
    marchive >> CHNVP(t_end);
    marchive >> CHNVP(Iy);
    marchive >> CHNVP(Iydt);
    marchive >> CHNVP(Iydtdt);
    marchive >> CHNVP(y_cont);
    marchive >> CHNVP(ydt_cont);
    marchive >> CHNVP(ydtdt_cont);
}